

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen-io.h
# Opt level: O0

istringstream * Eigen::operator>>(istringstream *iss,Vector *inst)

{
  Scalar SVar1;
  Vector *pVVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  istream *piVar6;
  long *plVar7;
  ExceptionSignal *pEVar8;
  Scalar *pSVar9;
  string_type local_208;
  ErrorCodeEnum local_1e4;
  uint local_1e0;
  undefined1 local_1d9;
  uint i;
  ErrorCodeEnum local_1b8;
  undefined1 local_1b1;
  string_type local_1b0;
  ErrorCodeEnum local_190;
  undefined1 local_189;
  string_type local_188;
  ErrorCodeEnum local_168;
  undefined1 local_161;
  string_type local_160;
  ErrorCodeEnum local_140 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  format fmt;
  Scalar SStack_28;
  char _ch;
  double _dbl_val;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *pDStack_18;
  uint _size;
  Vector *inst_local;
  istringstream *iss_local;
  
  pDStack_18 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)inst;
  inst_local = (Vector *)iss;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             "Failed to enter %s as vector. Reenter as [N](val1,val2,val3,...,valN)");
  std::__cxx11::istringstream::str();
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
            ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_110,&local_130)
  ;
  std::__cxx11::string::~string((string *)&local_130);
  piVar6 = std::operator>>((istream *)inst_local,fmt.loc_.super_type.m_storage.dummy_.data + 7);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
  if ((bVar3) && (fmt.loc_.super_type.m_storage.dummy_.data[7] != '[')) {
    local_161 = 1;
    pEVar8 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_140[0] = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_160,
               (basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar8,local_140,(string *)&local_160);
    local_161 = 0;
    __cxa_throw(pEVar8,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionSignal::~ExceptionSignal);
  }
  plVar7 = (long *)std::istream::operator>>((istream *)inst_local,(uint *)((long)&_dbl_val + 4));
  bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
  if ((!bVar3) || (bVar4 = std::ios::fail(), (bVar4 & 1) != 0)) {
    local_189 = 1;
    pEVar8 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_168 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_188,
               (basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar8,&local_168,(string *)&local_188);
    local_189 = 0;
    __cxa_throw(pEVar8,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionSignal::~ExceptionSignal);
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pDStack_18,
             (ulong)_dbl_val._4_4_);
  piVar6 = std::operator>>((istream *)inst_local,fmt.loc_.super_type.m_storage.dummy_.data + 7);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
  if ((bVar3) && (fmt.loc_.super_type.m_storage.dummy_.data[7] != ']')) {
    local_1b1 = 1;
    pEVar8 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_190 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_1b0,
               (basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar8,&local_190,(string *)&local_1b0);
    local_1b1 = 0;
    __cxa_throw(pEVar8,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionSignal::~ExceptionSignal);
  }
  piVar6 = std::operator>>((istream *)inst_local,fmt.loc_.super_type.m_storage.dummy_.data + 7);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
  if ((bVar3) && (fmt.loc_.super_type.m_storage.dummy_.data[7] != '(')) {
    local_1d9 = 1;
    pEVar8 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_1b8 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              ((string_type *)&i,
               (basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar8,&local_1b8,(string *)&i);
    local_1d9 = 0;
    __cxa_throw(pEVar8,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionSignal::~ExceptionSignal);
  }
  for (local_1e0 = 0; local_1e0 < _dbl_val._4_4_; local_1e0 = local_1e0 + 1) {
    std::istream::operator>>((istream *)inst_local,&stack0xffffffffffffffd8);
    iVar5 = std::istream::peek();
    if ((iVar5 == 0x2c) || (iVar5 = std::istream::peek(), iVar5 == 0x20)) {
      std::istream::ignore();
    }
    SVar1 = SStack_28;
    pSVar9 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDStack_18,(ulong)local_1e0);
    *pSVar9 = SVar1;
  }
  piVar6 = std::operator>>((istream *)inst_local,fmt.loc_.super_type.m_storage.dummy_.data + 7);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
  pVVar2 = inst_local;
  if ((bVar3) && (fmt.loc_.super_type.m_storage.dummy_.data[7] != ')')) {
    pEVar8 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_1e4 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_208,
               (basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar8,&local_1e4,(string *)&local_208);
    __cxa_throw(pEVar8,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionSignal::~ExceptionSignal);
  }
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  return (istringstream *)pVVar2;
}

Assistant:

inline std::istringstream &operator>>(std::istringstream &iss,
                                      dynamicgraph::Vector &inst) {
  unsigned int _size;
  double _dbl_val;
  char _ch;
  boost::format fmt(
      "Failed to enter %s as vector."
      " Reenter as [N](val1,val2,val3,...,valN)");
  fmt % iss.str();
  if (iss >> _ch && _ch != '[') {
    throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
  } else {
    if (iss >> _size && !iss.fail()) {
      inst.resize(_size);
    } else
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    if (iss >> _ch && _ch != ']')
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    else {
      if (iss >> _ch && _ch != '(')
        throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
      else {
        for (unsigned int i = 0; i < _size; i++) {
          iss >> _dbl_val;
          if (iss.peek() == ',' || iss.peek() == ' ') iss.ignore();
          inst(i) = _dbl_val;
        }
        if (iss >> _ch && _ch != ')')
          throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
      }
    }
  }
  return iss;
}